

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TCGTemp * tcg_global_mem_new_internal_mips64
                    (TCGContext_conflict5 *s,TCGType type,TCGv_ptr base,intptr_t offset,char *name)

{
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  bool bVar3;
  int bigendian;
  int indirect_reg;
  TCGTemp *ts;
  TCGTemp *base_ts;
  char *name_local;
  intptr_t offset_local;
  TCGv_ptr base_local;
  TCGType type_local;
  TCGContext_conflict5 *s_local;
  
  pTVar1 = tcgv_ptr_temp(s,base);
  pTVar2 = tcg_global_alloc(s);
  bVar3 = (*(ulong *)pTVar1 >> 0x20 & 1) == 0;
  if (bVar3) {
    *(ulong *)pTVar1 = *(ulong *)pTVar1 & 0xfffffffbffffffff | 0x400000000;
    s->nb_indirects = s->nb_indirects + 1;
  }
  *(ulong *)pTVar2 = *(ulong *)pTVar2 & 0xffffffffff00ffff | ((ulong)type & 0xff) << 0x10;
  *(ulong *)pTVar2 = *(ulong *)pTVar2 & 0xffffffff00ffffff | ((ulong)type & 0xff) << 0x18;
  *(ulong *)pTVar2 = *(ulong *)pTVar2 & 0xfffffffdffffffff | (ulong)bVar3 << 0x21;
  *(ulong *)pTVar2 = *(ulong *)pTVar2 & 0xffffffefffffffff | 0x1000000000;
  pTVar2->mem_base = pTVar1;
  pTVar2->mem_offset = offset;
  pTVar2->name = name;
  return pTVar2;
}

Assistant:

TCGTemp *tcg_global_mem_new_internal(TCGContext *s, TCGType type, TCGv_ptr base,
                                     intptr_t offset, const char *name)
{
    TCGTemp *base_ts = tcgv_ptr_temp(s, base);
    TCGTemp *ts = tcg_global_alloc(s);
    int indirect_reg = 0, bigendian = 0;
#ifdef HOST_WORDS_BIGENDIAN
    bigendian = 1;
#endif

    if (!base_ts->fixed_reg) {
        /* We do not support double-indirect registers.  */
        tcg_debug_assert(!base_ts->indirect_reg);
        base_ts->indirect_base = 1;
        s->nb_indirects += (TCG_TARGET_REG_BITS == 32 && type == TCG_TYPE_I64
                            ? 2 : 1);
        indirect_reg = 1;
    }

    if (TCG_TARGET_REG_BITS == 32 && type == TCG_TYPE_I64) {
        TCGTemp *ts2 = tcg_global_alloc(s);
        char buf[64];

        ts->base_type = TCG_TYPE_I64;
        ts->type = TCG_TYPE_I32;
        ts->indirect_reg = indirect_reg;
        ts->mem_allocated = 1;
        ts->mem_base = base_ts;
        ts->mem_offset = offset + bigendian * 4;
        pstrcpy(buf, sizeof(buf), name);
        pstrcat(buf, sizeof(buf), "_0");
        ts->name = g_strdup(buf);

        tcg_debug_assert(ts2 == ts + 1);
        ts2->base_type = TCG_TYPE_I64;
        ts2->type = TCG_TYPE_I32;
        ts2->indirect_reg = indirect_reg;
        ts2->mem_allocated = 1;
        ts2->mem_base = base_ts;
        ts2->mem_offset = offset + (1 - bigendian) * 4;
        pstrcpy(buf, sizeof(buf), name);
        pstrcat(buf, sizeof(buf), "_1");
        ts2->name = g_strdup(buf);
    } else {
        ts->base_type = type;
        ts->type = type;
        ts->indirect_reg = indirect_reg;
        ts->mem_allocated = 1;
        ts->mem_base = base_ts;
        ts->mem_offset = offset;
        ts->name = name;
    }
    return ts;
}